

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O0

PVIPNode *
PVIP_node_append_string_from_dec(PVIPParserContext *parser,PVIPNode *node,char *str,size_t len)

{
  PVIP_category_t PVar1;
  long lVar2;
  PVIPNode *pPVar3;
  char local_2c;
  char local_2b;
  char local_2a;
  undefined1 local_29;
  char c;
  size_t sStack_28;
  char buf [3];
  size_t len_local;
  char *str_local;
  PVIPNode *node_local;
  PVIPParserContext *parser_local;
  
  sStack_28 = len;
  PVar1 = PVIP_node_category(node->type);
  if (PVar1 != PVIP_CATEGORY_STRING) {
    __assert_fail("PVIP_node_category(node->type) == PVIP_CATEGORY_STRING",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                  ,0x95,
                  "PVIPNode *PVIP_node_append_string_from_dec(PVIPParserContext *, PVIPNode *, const char *, size_t)"
                 );
  }
  if (sStack_28 == 2) {
    local_2b = *str;
    local_2a = str[1];
    local_29 = 0;
    lVar2 = strtol(&local_2b,(char **)0x0,10);
    local_2c = (char)lVar2;
    pPVar3 = PVIP_node_append_string(parser,node,&local_2c,1);
    return pPVar3;
  }
  __assert_fail("len==2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tokuhirom[P]pvip/src/pvip_node.c"
                ,0x96,
                "PVIPNode *PVIP_node_append_string_from_dec(PVIPParserContext *, PVIPNode *, const char *, size_t)"
               );
}

Assistant:

PVIPNode* PVIP_node_append_string_from_dec(PVIPParserContext *parser, PVIPNode *node, const char* str, size_t len) {
    assert(PVIP_node_category(node->type) == PVIP_CATEGORY_STRING);
    assert(len==2);

    char buf[3];
    buf[0] = str[0];
    buf[1] = str[1];
    buf[2] = '\0';
    char c = strtol(buf, NULL, 10);
    return PVIP_node_append_string(parser, node, &c, 1);
}